

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O2

uint32_t __thiscall
icu_63::CollationDataBuilder::setPrimaryRangeAndReturnNext
          (CollationDataBuilder *this,UChar32 start,UChar32 end,uint32_t primary,int32_t step,
          UErrorCode *errorCode)

{
  bool bVar1;
  UBool UVar2;
  int iVar3;
  uint32_t uVar4;
  
  uVar4 = 0;
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    iVar3 = (*(this->super_UObject)._vptr_UObject[3])(this,(ulong)(primary >> 0x18));
    UVar2 = maybeSetPrimaryRange(this,start,end,primary,step,errorCode);
    if (UVar2 != '\0') {
      uVar4 = Collation::incThreeBytePrimaryByOffset
                        (primary,(UBool)iVar3,((end - start) + 1) * step);
      return uVar4;
    }
    do {
      utrie2_set32_63(this->trie,start,primary | 0xc1,errorCode);
      uVar4 = Collation::incThreeBytePrimaryByOffset(primary,(UBool)iVar3,step);
      bVar1 = start < end;
      primary = uVar4;
      start = start + 1;
    } while (bVar1);
  }
  return uVar4;
}

Assistant:

uint32_t
CollationDataBuilder::setPrimaryRangeAndReturnNext(UChar32 start, UChar32 end,
                                                   uint32_t primary, int32_t step,
                                                   UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return 0; }
    UBool isCompressible = isCompressiblePrimary(primary);
    if(maybeSetPrimaryRange(start, end, primary, step, errorCode)) {
        return Collation::incThreeBytePrimaryByOffset(primary, isCompressible,
                                                      (end - start + 1) * step);
    } else {
        // Short range: Set individual CE32s.
        for(;;) {
            utrie2_set32(trie, start, Collation::makeLongPrimaryCE32(primary), &errorCode);
            ++start;
            primary = Collation::incThreeBytePrimaryByOffset(primary, isCompressible, step);
            if(start > end) { return primary; }
        }
        modified = TRUE;
    }
}